

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O2

tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
pfederc::optimizeUnOpExpr(UnOpExpr *expr,size_t *reducedexpressions)

{
  undefined8 uVar1;
  size_t *in_RDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX_00;
  _Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false> _Var2;
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> tVar3;
  undefined1 local_30 [16];
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_20;
  
  local_30._0_8_ = reducedexpressions[8];
  reducedexpressions[8] = 0;
  optimizeAll((pfederc *)(local_30 + 8),
              (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_30,in_RDX);
  if ((Expr *)local_30._0_8_ != (Expr *)0x0) {
    (*(*(_func_int ***)local_30._0_8_)[1])();
  }
  local_20._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       *(tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> *)
        &((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> *)
         (reducedexpressions + 7))->super__Head_base<0UL,_pfederc::Expr_*,_false>;
  std::
  make_unique<pfederc::UnOpExpr,pfederc::Lexer_const&,pfederc::Position_const&,pfederc::Token_const*,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
            ((Lexer *)local_30,(Position *)reducedexpressions[2],(Token **)(reducedexpressions + 4),
             (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_20);
  uVar1 = local_30._0_8_;
  local_30._0_8_ = (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
  std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)local_30);
  UnOpExpr::~UnOpExpr((UnOpExpr *)reducedexpressions);
  operator_delete(reducedexpressions,0x48);
  *(undefined1 *)&(expr->super_Expr)._vptr_Expr = 0;
  (expr->super_Expr).parent = (Expr *)uVar1;
  _Var2._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       extraout_RDX._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if ((long *)local_30._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_30._8_8_ + 8))();
    _Var2._M_head_impl._M_t.
    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         extraout_RDX_00._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  }
  tVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       _Var2._M_head_impl._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  tVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  _0_8_ = expr;
  return (tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>)
         tVar3.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
  ;
}

Assistant:

std::tuple<std::unique_ptr<Expr>, bool /* changed */> pfederc::optimizeUnOpExpr(
    UnOpExpr *expr, size_t &reducedexpressions) noexcept {
  std::unique_ptr<Expr> newincludedexpr = optimizeAll(expr->getExpressionPtr(), reducedexpressions);
  std::unique_ptr<Expr> newexpr = std::make_unique<UnOpExpr>(expr->getLexer(),
      expr->getPosition(), &(expr->getOperatorToken()),
        std::move(newincludedexpr));
  delete expr;

  return std::tuple<std::unique_ptr<Expr>, bool>(std::move(newexpr), false);
}